

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_blob_detection.cpp
# Opt level: O2

void addTests_Blob_Detection(UnitTestFramework *framework)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"blob_detection::Detect one blob",&local_31);
  UnitTestFramework::add(framework,blob_detection::Detect1Blob,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void addTests_Blob_Detection( UnitTestFramework & framework )
{
    framework.add( blob_detection::Detect1Blob, "blob_detection::Detect one blob" );
}